

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void __thiscall testing::internal::RE::Init(RE *this,char *regex)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  Message *pMVar5;
  char *message;
  char *in_R9;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *partial_regex;
  char *full_pattern;
  size_t full_regex_len;
  RE *this_local;
  Message local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  char *regex_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)regex;
  pcVar3 = posix::StrDup(regex);
  *(char **)this = pcVar3;
  sVar4 = strlen((char *)gtest_ar_.message_.ptr_);
  pcVar3 = (char *)operator_new__(sVar4 + 10);
  snprintf(pcVar3,sVar4 + 10,"^(%s)$",gtest_ar_.message_.ptr_);
  iVar2 = regcomp((regex_t *)(this + 0x10),pcVar3,1);
  this[8] = (RE)(iVar2 == 0);
  if (((byte)this[8] & 1) != 0) {
    if ((gtest_ar_.message_.ptr_)->_M_dataplus == (_Alloc_hider)0x0) {
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1eaa19;
    }
    else {
      local_98 = gtest_ar_.message_.ptr_;
    }
    iVar2 = regcomp((regex_t *)(this + 0x50),(char *)local_98,1);
    this[8] = (RE)(iVar2 == 0);
  }
  AssertionResult::AssertionResult<bool>((AssertionResult *)local_48,(bool *)(this + 8),(type *)0x0)
  ;
  bVar1 = AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    Message::Message(&local_50);
    pMVar5 = Message::operator<<(&local_50,(char (*) [21])"Regular expression \"");
    pMVar5 = Message::operator<<(pMVar5,(char **)&gtest_ar_.message_);
    pMVar5 = Message::operator<<(pMVar5,(char (*) [52])
                                        "\" is not a valid POSIX Extended regular expression.");
    GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&regex_local,(internal *)local_48,(AssertionResult *)"is_valid_","false",
               "true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    AssertHelper::AssertHelper
              ((AssertHelper *)&this_local,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-port.cc"
               ,0x2a1,message);
    AssertHelper::operator=((AssertHelper *)&this_local,pMVar5);
    AssertHelper::~AssertHelper((AssertHelper *)&this_local);
    std::__cxx11::string::~string((string *)&regex_local);
    Message::~Message(&local_50);
  }
  AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void RE::Init(const char* regex) {
  pattern_ = posix::StrDup(regex);

  // Reserves enough bytes to hold the regular expression used for a
  // full match.
  const size_t full_regex_len = strlen(regex) + 10;
  char* const full_pattern = new char[full_regex_len];

  snprintf(full_pattern, full_regex_len, "^(%s)$", regex);
  is_valid_ = regcomp(&full_regex_, full_pattern, REG_EXTENDED) == 0;
  // We want to call regcomp(&partial_regex_, ...) even if the
  // previous expression returns false.  Otherwise partial_regex_ may
  // not be properly initialized can may cause trouble when it's
  // freed.
  //
  // Some implementation of POSIX regex (e.g. on at least some
  // versions of Cygwin) doesn't accept the empty string as a valid
  // regex.  We change it to an equivalent form "()" to be safe.
  if (is_valid_) {
    const char* const partial_regex = (*regex == '\0') ? "()" : regex;
    is_valid_ = regcomp(&partial_regex_, partial_regex, REG_EXTENDED) == 0;
  }
  EXPECT_TRUE(is_valid_)
      << "Regular expression \"" << regex
      << "\" is not a valid POSIX Extended regular expression.";

  delete[] full_pattern;
}